

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QMdiAreaPrivate::setChildActivationEnabled
          (QMdiAreaPrivate *this,bool enable,bool onlyNextActivationEvent)

{
  long lVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = (this->childWindows).d.size;
  if (lVar1 != 0) {
    pQVar2 = (this->childWindows).d.ptr;
    lVar4 = 0;
    do {
      lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar4);
      if ((((lVar3 != 0) && (*(int *)(lVar3 + 4) != 0)) &&
          (lVar3 = *(long *)((long)&(pQVar2->wp).value + lVar4), lVar3 != 0)) &&
         ((*(byte *)(*(long *)(lVar3 + 0x20) + 9) & 0x80) != 0)) {
        if (onlyNextActivationEvent) {
          *(bool *)(*(long *)(lVar3 + 8) + 0x2d6) = !enable;
        }
        else {
          *(bool *)(*(long *)(lVar3 + 8) + 0x2d7) = enable;
        }
      }
      lVar4 = lVar4 + 0x10;
    } while (lVar1 << 4 != lVar4);
  }
  return;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }